

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O1

lookahead_entry * av1_lookahead_pop(lookahead_ctx *ctx,int drain,COMPRESSOR_STAGE stage)

{
  int iVar1;
  int iVar2;
  lookahead_entry *plVar3;
  int iVar4;
  int iVar5;
  
  if (ctx != (lookahead_ctx *)0x0) {
    iVar1 = ctx->read_ctxs[stage].sz;
    if (iVar1 != 0) {
      if ((drain != 0) || (iVar1 == ctx->read_ctxs[stage].pop_sz)) {
        iVar2 = ctx->read_ctxs[stage].read_idx;
        iVar4 = iVar2 + 1;
        iVar5 = 0;
        if (ctx->max_sz <= iVar4) {
          iVar5 = ctx->max_sz;
        }
        plVar3 = ctx->buf;
        ctx->read_ctxs[stage].read_idx = iVar4 - iVar5;
        ctx->read_ctxs[stage].sz = iVar1 + -1;
        return plVar3 + iVar2;
      }
    }
  }
  return (lookahead_entry *)0x0;
}

Assistant:

struct lookahead_entry *av1_lookahead_pop(struct lookahead_ctx *ctx, int drain,
                                          COMPRESSOR_STAGE stage) {
  struct lookahead_entry *buf = NULL;
  if (ctx) {
    struct read_ctx *read_ctx = &ctx->read_ctxs[stage];
    assert(read_ctx->valid == 1);
    if (read_ctx->sz && (drain || read_ctx->sz == read_ctx->pop_sz)) {
      buf = pop(ctx, &read_ctx->read_idx);
      read_ctx->sz--;
    }
  }
  return buf;
}